

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2074e18::AV1HighbdCompAvgPredTest_CheckOutput_Test::TestBody
          (AV1HighbdCompAvgPredTest_CheckOutput_Test *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  anon_enum_8 aVar4;
  byte bVar5;
  byte bVar6;
  _func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int *p_Var7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  int iVar10;
  ParamType *pPVar11;
  long lVar12;
  undefined4 extraout_var;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  SEARCH_METHODS *message;
  ulong uVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  AssertionResult gtest_ar;
  Message local_70;
  AssertHelper local_68;
  undefined8 local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  internal local_40 [8];
  undefined8 *local_38;
  
  pPVar11 = testing::
            WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
            ::GetParam();
  p_Var7 = (pPVar11->
           super__Tuple_impl<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
           ).
           super__Head_base<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_false>
           ._M_head_impl;
  pPVar11 = testing::
            WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>_>
            ::GetParam();
  aVar4 = (pPVar11->
          super__Tuple_impl<0UL,_void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE,_int>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE,_int>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
          _M_head_impl;
  bVar5 = ::block_size_wide[aVar4];
  uVar15 = (ulong)bVar5;
  bVar6 = ::block_size_high[aVar4];
  uVar13 = (ulong)bVar6;
  aom_highbd_comp_avg_pred_c
            ((uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred1_ >> 1),
             (uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).pred_ >> 1),(uint)bVar5,
             (uint)bVar6,(uint8_t *)((ulong)(this->super_AV1HighbdCompAvgPredTest).ref_ >> 1),0x80);
  (*p_Var7)((uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred2_ >> 1),
            (uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).pred_ >> 1),(int)bVar5,
            (int)bVar6,(uchar *)((ulong)(this->super_AV1HighbdCompAvgPredTest).ref_ >> 1),0x80);
  local_48 = (ulong)((uint)bVar5 + (uint)bVar5);
  uVar1 = uVar15 - 1;
  lVar19 = 2;
  lVar18 = 0;
  uVar17 = 0;
  local_60 = 0;
  local_58 = uVar13;
  local_50 = uVar15;
  do {
    uVar14 = uVar17 * uVar15;
    puVar8 = (this->super_AV1HighbdCompAvgPredTest).comp_pred1_;
    puVar9 = (this->super_AV1HighbdCompAvgPredTest).comp_pred2_;
    bVar20 = true;
    uVar16 = 0;
    if (puVar8[uVar14] == puVar9[uVar14]) {
      lVar12 = (long)puVar8 + lVar19;
      uVar14 = 0;
      do {
        if (uVar1 == uVar14) goto LAB_0073920a;
        lVar2 = uVar14 * 2;
        uVar16 = uVar14 + 1;
        lVar3 = uVar14 * 2;
        uVar14 = uVar16;
      } while (*(short *)(lVar12 + lVar2) == *(short *)((long)puVar9 + lVar3 + lVar19));
      bVar20 = uVar16 < uVar15;
      uVar14 = uVar16 - lVar18;
    }
    printf("%dx%d mismatch @%d(%d,%d) ",uVar15,uVar13,uVar14 & 0xffffffff,uVar16,uVar17 & 0xffffffff
          );
    iVar10 = printf("%d != %d ",(ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred1_[uVar14],
                    (ulong)(this->super_AV1HighbdCompAvgPredTest).comp_pred2_[uVar14]);
    lVar12 = CONCAT44(extraout_var,iVar10);
    uVar13 = local_58;
    uVar15 = local_50;
    if (bVar20) break;
LAB_0073920a:
    uVar17 = uVar17 + 1;
    lVar18 = lVar18 - uVar15;
    lVar19 = lVar19 + local_48;
    local_60 = CONCAT71((int7)((ulong)lVar12 >> 8),uVar13 <= uVar17);
  } while (uVar17 != uVar13);
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (byte)local_60 & 1;
  local_68.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_40,"CheckResult(w, h)","true",(bool *)&local_70,(bool *)&local_68);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_38 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/comp_mask_pred_test.cc"
               ,0x328,(char *)message);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)CONCAT71(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         (byte)local_70.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     (byte)local_70.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(local_38);
  }
  return;
}

Assistant:

TEST_P(AV1HighbdCompAvgPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}